

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_synth.cpp
# Opt level: O1

void __thiscall SaveButton::~SaveButton(SaveButton *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ToggleButton).super_Button.super_Widget._vptr_Widget =
       (_func_int **)&PTR__Button_0010e808;
  pcVar2 = (this->super_ToggleButton).super_Button.text._M_dataplus._M_p;
  paVar1 = &(this->super_ToggleButton).super_Button.text.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x60);
  return;
}

Assistant:

SaveButton() : ToggleButton("Save raw") {}